

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

size_t nhdp_domain_encode_mprtypes_tlvvalue(uint8_t *mprtypes,size_t mprtypes_size)

{
  list_entity *plVar1;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t count;
  nhdp_domain *domain;
  size_t mprtypes_size_local;
  uint8_t *mprtypes_local;
  
  __tempptr = (list_entity *)0x0;
  count = (size_t)(_domain_list.next + -0x2a);
  while( true ) {
    if (*(list_entity **)(count + 0x2a8) == _domain_list.prev) {
      return (size_t)__tempptr;
    }
    plVar1 = (list_entity *)((long)&__tempptr->next + 1);
    mprtypes[(long)__tempptr] = *(uint8_t *)(count + 0x31);
    if (mprtypes_size <= plVar1) break;
    count = *(long *)(count + 0x2a0) - 0x2a0;
    __tempptr = plVar1;
  }
  return (size_t)plVar1;
}

Assistant:

size_t
nhdp_domain_encode_mprtypes_tlvvalue(uint8_t *mprtypes, size_t mprtypes_size) {
  struct nhdp_domain *domain;
  size_t count;

  count = 0;
  list_for_each_element(&_domain_list, domain, _node) {
    mprtypes[count++] = domain->ext;

    if (count >= mprtypes_size) {
      break;
    }
  }

  return count;
}